

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexical.h
# Opt level: O0

Node * __thiscall Lexical::mainProgram(Node *__return_storage_ptr__,Lexical *this)

{
  bool bVar1;
  int iVar2;
  reference __lhs;
  int local_170;
  allocator local_169;
  string local_168 [32];
  Node local_148;
  int local_100;
  allocator local_f9;
  string local_f8 [39];
  undefined1 local_d1;
  undefined4 local_d0;
  allocator local_c9;
  string local_c8 [36];
  int local_a4;
  undefined1 local_a0 [8];
  Node subSon;
  allocator local_41;
  string local_40 [32];
  int local_20;
  int local_1c;
  Lexical *pLStack_18;
  int beginIndex;
  Lexical *this_local;
  Node *now;
  
  pLStack_18 = this;
  this_local = (Lexical *)__return_storage_ptr__;
  Generator::pushIndex(&this->generator);
  local_1c = this->wordIndex;
  local_20 = -1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"main",&local_41);
  addProcedure(this,&local_20,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_a4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"main",&local_c9);
  subProgram((Node *)local_a0,this,&local_a4,(string *)local_c8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  bVar1 = Node::operator==((Node *)local_a0,&nullNode);
  if (bVar1) {
    errorParsing(__return_storage_ptr__,this,&local_1c,-1,-1);
  }
  else {
    iVar2 = this->wordIndex + 1;
    this->wordIndex = iVar2;
    __lhs = std::vector<Word,_std::allocator<Word>_>::operator[](&this->words,(long)iVar2);
    bVar1 = std::operator!=(&__lhs->token,".");
    if (bVar1) {
      errorParsing(__return_storage_ptr__,this,&local_1c,-1,-1);
    }
    else {
      local_d1 = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"main",&local_f9);
      local_100 = this->nodeCnt;
      this->nodeCnt = local_100 + 1;
      Node::Node(__return_storage_ptr__,(string *)local_f8,&local_100,&local_1c,&this->wordIndex);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      Node::insertSon(__return_storage_ptr__,(Node *)local_a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_168,".",&local_169);
      local_170 = this->nodeCnt;
      this->nodeCnt = local_170 + 1;
      Node::Node(&local_148,(string *)local_168,&local_170,&this->wordIndex,&this->wordIndex);
      Node::insertSon(__return_storage_ptr__,&local_148);
      Node::~Node(&local_148);
      std::__cxx11::string::~string(local_168);
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
      this->lastErrorIndex = -1;
      this->lastErrorCode = -1;
      Generator::popIndex(&this->generator);
      local_d1 = 1;
    }
  }
  local_d0 = 1;
  Node::~Node((Node *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

Node mainProgram() {
		generator.pushIndex();
		int beginIndex = wordIndex;
		addProcedure(-1, "main");

		Node subSon = subProgram(0, "main");
		if (subSon == nullNode) return errorParsing(beginIndex);

		if (words[++wordIndex].token != ".") return errorParsing(beginIndex); // BASE ERROR

		Node now = Node("main", nodeCnt++, beginIndex, wordIndex);
		now.insertSon(subSon);
		now.insertSon(Node(".", nodeCnt++, wordIndex, wordIndex));

		lastErrorIndex = -1;
		lastErrorCode = -1;
		generator.popIndex();
		return now;
	}